

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

int gauden_invert_variance_full(gauden_t *g)

{
  int32 iVar1;
  undefined8 in_RAX;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = 0;
  do {
    if (g->n_mgau <= uVar2) {
      return 0;
    }
    for (uVar4 = 0; uVar4 < g->n_feat; uVar4 = uVar4 + 1) {
      for (uVar3 = 0; uVar3 < g->n_density; uVar3 = uVar3 + 1) {
        iVar1 = invert((float32 **)g->fullvar[uVar2][uVar4][uVar3],
                       (float32 **)g->fullvar[uVar2][uVar4][uVar3],g->veclen[uVar4]);
        if (iVar1 != 0) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                  ,499,"Singular covariance matrix ([%d][%d][%d]), can\'t continue!\n",
                  uVar2 & 0xffffffff,uVar4 & 0xffffffff,
                  CONCAT44((int)((ulong)in_RAX >> 0x20),(int)uVar3));
          exit(1);
        }
      }
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

int
gauden_invert_variance_full(gauden_t *g)
{
    uint32 i, j, k;

    for (i = 0; i < g->n_mgau; i++) {
	for (j = 0; j < g->n_feat; j++) {
	    for (k = 0; k < g->n_density; k++) {
		/* Yes, this works in-place (we hope) */
		if (invert(g->fullvar[i][j][k], g->fullvar[i][j][k],
			   g->veclen[j]) != S3_SUCCESS) {
		    /* Shouldn't get here, due to the check in full_norm() */
		    E_FATAL("Singular covariance matrix ([%d][%d][%d]), can't continue!\n",
			    i, j, k);
		}
	    }
	}
    }

    return S3_SUCCESS;
}